

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int * GetCodepoints(char *text,int *count)

{
  uint uVar1;
  int iVar2;
  int i;
  int iVar3;
  int iVar4;
  int *piVar5;
  int bytesProcessed;
  int local_3c;
  int *local_38;
  
  piVar5 = GetCodepoints::codepoints;
  iVar4 = 0;
  local_38 = count;
  memset(GetCodepoints::codepoints,0,0x800);
  local_3c = 0;
  uVar1 = TextLength(text);
  for (iVar3 = 0; iVar3 < (int)uVar1; iVar3 = iVar3 + local_3c) {
    iVar2 = GetNextCodepoint(text + iVar3,&local_3c);
    *piVar5 = iVar2;
    iVar4 = iVar4 + 1;
    piVar5 = piVar5 + 1;
  }
  *local_38 = iVar4;
  return GetCodepoints::codepoints;
}

Assistant:

int *GetCodepoints(const char *text, int *count)
{
    static int codepoints[MAX_TEXT_UNICODE_CHARS] = { 0 };
    memset(codepoints, 0, MAX_TEXT_UNICODE_CHARS*sizeof(int));

    int bytesProcessed = 0;
    int textLength = TextLength(text);
    int codepointsCount = 0;

    for (int i = 0; i < textLength; codepointsCount++)
    {
        codepoints[codepointsCount] = GetNextCodepoint(text + i, &bytesProcessed);
        i += bytesProcessed;
    }

    *count = codepointsCount;

    return codepoints;
}